

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderProperties.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderPropertiesProgramObject::initTest
          (TessellationShaderPropertiesProgramObject *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar5;
  int local_30;
  int local_2c;
  GLint vs_compile_status;
  GLint fs_compile_status;
  char *vs_body;
  char *fs_body;
  Functions *gl;
  TessellationShaderPropertiesProgramObject *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  fs_body = (char *)CONCAT44(extraout_var,iVar1);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    GVar2 = (**(code **)(fs_body + 0x3c8))();
    this->m_po_id = GVar2;
    dVar3 = (**(code **)(fs_body + 0x800))();
    glu::checkError(dVar3,"glCreateProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0xd5);
    GVar2 = (**(code **)(fs_body + 0x3f0))(0x8b30);
    this->m_fs_id = GVar2;
    GVar2 = (**(code **)(fs_body + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
    this->m_tc_id = GVar2;
    GVar2 = (**(code **)(fs_body + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
    this->m_te_id = GVar2;
    GVar2 = (**(code **)(fs_body + 0x3f0))(0x8b31);
    this->m_vs_id = GVar2;
    dVar3 = (**(code **)(fs_body + 0x800))();
    glu::checkError(dVar3,"glCreateShader() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0xdb);
    (**(code **)(fs_body + 0x10))(this->m_po_id,this->m_fs_id);
    (**(code **)(fs_body + 0x10))(this->m_po_id,this->m_tc_id);
    (**(code **)(fs_body + 0x10))(this->m_po_id,this->m_te_id);
    (**(code **)(fs_body + 0x10))(this->m_po_id,this->m_vs_id);
    dVar3 = (**(code **)(fs_body + 0x800))();
    glu::checkError(dVar3,"glAttachShader() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0xe2);
    vs_body = "${VERSION}\n\nvoid main()\n{\n}\n";
    _vs_compile_status = "${VERSION}\n\nvoid main()\n{\n}\n";
    local_2c = 0;
    local_30 = 0;
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,this->m_fs_id,1,&vs_body);
    TestCaseBase::shaderSourceSpecialized
              (&this->super_TestCaseBase,this->m_vs_id,1,(GLchar **)&vs_compile_status);
    dVar3 = (**(code **)(fs_body + 0x800))();
    glu::checkError(dVar3,"glShaderSource() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0xf7);
    (**(code **)(fs_body + 0x248))(this->m_fs_id);
    (**(code **)(fs_body + 0x248))(this->m_vs_id);
    dVar3 = (**(code **)(fs_body + 0x800))();
    glu::checkError(dVar3,"glCompileShader() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0xfb);
    (**(code **)(fs_body + 0xa70))(this->m_fs_id,0x8b81,&local_2c);
    (**(code **)(fs_body + 0xa70))(this->m_vs_id,0x8b81,&local_30);
    dVar3 = (**(code **)(fs_body + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                    ,0xff);
    if (local_2c != 1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Could not compile fragment shader",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x103);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (local_30 != 1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Could not compile vertex shader",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderProperties.cpp"
                 ,0x108);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return;
}

Assistant:

void TessellationShaderPropertiesProgramObject::initTest(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Do not execute if required extension is not supported */
	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	/* Generate all objects */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	m_te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Attach the shader to the program object */
	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_tc_id);
	gl.attachShader(m_po_id, m_te_id);
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() failed");

	/* Since this test does not care much about fragment & vertex shaders, set
	 * their bodies and compile these shaders now */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	glw::GLint fs_compile_status = GL_FALSE;
	glw::GLint vs_compile_status = GL_FALSE;

	shaderSourceSpecialized(m_fs_id, 1 /* count */, &fs_body);
	shaderSourceSpecialized(m_vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed");

	gl.compileShader(m_fs_id);
	gl.compileShader(m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed");

	gl.getShaderiv(m_fs_id, GL_COMPILE_STATUS, &fs_compile_status);
	gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &vs_compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed");

	if (fs_compile_status != GL_TRUE)
	{
		TCU_FAIL("Could not compile fragment shader");
	}

	if (vs_compile_status != GL_TRUE)
	{
		TCU_FAIL("Could not compile vertex shader");
	}
}